

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  msghdr msgHdr;
  undefined2 local_1c;
  ushort local_1a;
  undefined4 local_18;
  undefined8 local_14;
  undefined8 uStack_c;
  uint local_4;
  
  msgHdr.msg_name = (void *)0x0;
  msgHdr.msg_namelen = 0;
  msgHdr._12_4_ = 0;
  msgHdr.msg_control = (void *)0x0;
  msgHdr.msg_controllen = 0;
  msgHdr.msg_flags = 0;
  msgHdr._52_4_ = 0;
  if (address != (ENetAddress *)0x0) {
    msgHdr.msg_name = &local_1c;
    local_18 = 0;
    local_1c = 10;
    local_1a = address->port << 8 | address->port >> 8;
    local_14 = *(undefined8 *)&(address->host).__in6_u;
    uStack_c = *(undefined8 *)((long)&(address->host).__in6_u + 8);
    local_4 = (uint)address->sin6_scope_id;
    msgHdr.msg_namelen = 0x1c;
    msgHdr._12_4_ = 0;
  }
  msgHdr.msg_iov = (iovec *)buffers;
  msgHdr.msg_iovlen = bufferCount;
  sVar2 = sendmsg(socket,(msghdr *)&msgHdr,0x4000);
  if ((int)sVar2 != -1) {
    return (int)sVar2;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar1 != 0x5a) {
    if (iVar1 == 0xb) {
      return 0;
    }
    if (iVar1 != 4) {
      return -1;
    }
  }
  return -2;
}

Assistant:

int enet_socket_send(ENetSocket socket, const ENetAddress *address, const ENetBuffer *buffers, size_t bufferCount) {
        struct msghdr msgHdr;
        struct sockaddr_in6 sin;
        int sentLength;

        memset(&msgHdr, 0, sizeof(struct msghdr));

        if (address != NULL) {
            memset(&sin, 0, sizeof(struct sockaddr_in6));

            sin.sin6_family     = AF_INET6;
            sin.sin6_port       = ENET_HOST_TO_NET_16(address->port);
            sin.sin6_addr       = address->host;
            sin.sin6_scope_id   = address->sin6_scope_id;

            msgHdr.msg_name    = &sin;
            msgHdr.msg_namelen = sizeof(struct sockaddr_in6);
        }

        msgHdr.msg_iov    = (struct iovec *) buffers;
        msgHdr.msg_iovlen = bufferCount;

        sentLength = sendmsg(socket, &msgHdr, MSG_NOSIGNAL);

        if (sentLength == -1) {
            switch (errno)
            {
                case EWOULDBLOCK:
                    return 0;
                case EINTR:
                case EMSGSIZE:
                    return -2;
                default:
                    return -1;
            }

            return -1;
        }

        return sentLength;
    }